

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O2

void __thiscall
DemoScripts::TrainVanillaIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  int iVar1;
  size_t sVar2;
  INeuron *pIVar3;
  ILayer *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  int activationId;
  ulong uVar8;
  float extraout_XMM0_Da;
  float fVar9;
  float local_624;
  float S;
  vector<float,_std::allocator<float>_> deltas;
  _Vector_base<float,_std::allocator<float>_> local_5f8;
  vector<float,_std::allocator<float>_> softMax;
  INeuronBuilder local_5b8;
  vector<float,_std::allocator<float>_> result;
  VanillaSynapseBuilder synapseBuilder;
  Dataset data;
  _Vector_base<float,_std::allocator<float>_> local_528;
  undefined1 local_510 [40];
  size_t local_4e8;
  INeuronBuilder *local_4e0;
  undefined8 local_4d8;
  undefined1 local_4d0 [40];
  size_t local_4a8;
  INeuronBuilder *local_4a0;
  undefined8 local_498;
  undefined1 local_490 [40];
  size_t local_468;
  INeuronBuilder *local_460;
  undefined8 local_458;
  DenseVanillaLayer hidden;
  DenseVanillaLayer input;
  DenseVanillaLayer output;
  
  local_5b8._vptr_INeuronBuilder = (_func_int **)_ITM_registerTMCloneTable;
  local_490._0_4_ = 0.0;
  std::__cxx11::string::string((string *)(local_490 + 8),"input",(allocator *)&hidden);
  local_468 = 4;
  local_458._0_4_ = 0.0;
  local_458._4_4_ = 0.0;
  local_460 = &local_5b8;
  DenseVanillaLayer::DenseVanillaLayer(&input,(LayerMeta *)local_490);
  std::__cxx11::string::~string((string *)(local_490 + 8));
  local_4d0._0_4_ = 0.0;
  std::__cxx11::string::string((string *)(local_4d0 + 8),"hidden1",(allocator *)&output);
  local_4a8 = 0xf;
  local_498._0_4_ = 0.0;
  local_498._4_4_ = 0.0;
  local_4a0 = &local_5b8;
  DenseVanillaLayer::DenseVanillaLayer(&hidden,(LayerMeta *)local_4d0);
  std::__cxx11::string::~string((string *)(local_4d0 + 8));
  local_510._0_4_ = 0.0;
  std::__cxx11::string::string((string *)(local_510 + 8),"output",(allocator *)&data);
  local_4e8 = 3;
  local_4d8._0_4_ = 0.0;
  local_4d8._4_4_ = 0.0;
  local_4e0 = &local_5b8;
  DenseVanillaLayer::DenseVanillaLayer(&output,(LayerMeta *)local_510);
  std::__cxx11::string::~string((string *)(local_510 + 8));
  sVar2 = ILayer::GetSize(&hidden.super_ILayer);
  DenseVanillaLayer::Init(&input,sVar2,generator,0.0);
  sVar2 = ILayer::GetSize(&output.super_ILayer);
  DenseVanillaLayer::Init(&input,sVar2,generator,0.0);
  DenseVanillaLayer::Init(&input,0,generator,0.0);
  VanillaSynapseBuilder::VanillaSynapseBuilder
            (&synapseBuilder,(linear_congruential_engine *)generator);
  ILayer::BindWithNext(&input.super_ILayer,&hidden.super_ILayer,(ISynapseBuilder *)&synapseBuilder);
  ILayer::BindWithNext(&hidden.super_ILayer,&output.super_ILayer,(ISynapseBuilder *)&synapseBuilder)
  ;
  data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.xTest.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.xTrain.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&deltas,path,(allocator *)&softMax);
  IRIS::ReadIris((string *)&deltas,&data,0.2);
  std::__cxx11::string::~string((string *)&deltas);
  DATA_CONVERSION::ConvertDataToTimings(&data,1.0);
  for (iVar6 = 0; iVar6 != 1000; iVar6 = iVar6 + 1) {
    local_624 = 0.0;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)data.xTrain.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)data.xTrain.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1)
    {
      for (uVar8 = 0; sVar2 = ILayer::GetSize(&input.super_ILayer), uVar8 < sVar2; uVar8 = uVar8 + 1
          ) {
        pIVar3 = ILayer::operator[](&input.super_ILayer,uVar8);
        (**pIVar3->_vptr_INeuron)
                  (0,data.xTrain.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8],pIVar3);
      }
      DenseVanillaLayer::Forward(&hidden);
      DenseVanillaLayer::Forward((DenseVanillaLayer *)&output.super_ILayer);
      deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      deltas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      softMax.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      S = 0.0;
      sVar2 = ILayer::GetSize(&output.super_ILayer);
      std::vector<float,_std::allocator<float>_>::vector(&result,sVar2,(allocator_type *)&local_5f8)
      ;
      for (uVar8 = 0; sVar2 = ILayer::GetSize(&output.super_ILayer), uVar8 < sVar2;
          uVar8 = uVar8 + 1) {
        pIVar3 = ILayer::operator[](&output.super_ILayer,uVar8);
        (*pIVar3->_vptr_INeuron[4])(pIVar3);
        result.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = extraout_XMM0_Da;
      }
      fVar9 = SoftMaxLoss(&result,data.yTrain.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar7],&softMax,&deltas,
                          &S);
      DenseVanillaLayer::Backward((DenseVanillaLayer *)&output.super_ILayer,&deltas);
      local_5f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_5f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_5f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DenseVanillaLayer::Backward(&hidden,(vector<float,_std::allocator<float>_> *)&local_5f8);
      local_528._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_528._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_528._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DenseVanillaLayer::Backward
                ((DenseVanillaLayer *)&input.super_ILayer,
                 (vector<float,_std::allocator<float>_> *)&local_528);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_528);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_5f8);
      DenseVanillaLayer::GradStep
                ((DenseVanillaLayer *)&output.super_ILayer,1,0.1,0.1,0.0,false,0.0,false);
      DenseVanillaLayer::GradStep(&hidden,1,0.1,0.1,0.0,false,0.0,false);
      DenseVanillaLayer::GradStep
                ((DenseVanillaLayer *)&input.super_ILayer,1,0.1,0.1,0.0,true,0.0,false);
      pIVar4 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)&output.super_ILayer);
      iVar1 = (*pIVar4->_vptr_ILayer[7])(pIVar4);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                ((long *)CONCAT44(extraout_var,iVar1));
      pIVar4 = DenseVanillaLayer::ResetPotentials(&hidden);
      iVar1 = (*pIVar4->_vptr_ILayer[7])(pIVar4);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                ((long *)CONCAT44(extraout_var_00,iVar1));
      pIVar4 = DenseVanillaLayer::ResetPotentials((DenseVanillaLayer *)&input.super_ILayer);
      iVar1 = (*pIVar4->_vptr_ILayer[7])(pIVar4);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x28))
                ((long *)CONCAT44(extraout_var_01,iVar1));
      local_624 = local_624 + fVar9;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&result.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&softMax.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&deltas.super__Vector_base<float,_std::allocator<float>_>);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Loss for epoch: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
    poVar5 = std::operator<<(poVar5," is: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,local_624 /
                               (float)(ulong)(((long)data.xTrain.
                                                                                                          
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)data.xTrain.
                                                                                                        
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)
                       );
    std::operator<<(poVar5,"\n");
  }
  SPIKING_NN::Dataset::~Dataset(&data);
  ILayer::~ILayer(&output.super_ILayer);
  ILayer::~ILayer(&hidden.super_ILayer);
  ILayer::~ILayer(&input.super_ILayer);
  return;
}

Assistant:

void DemoScripts::TrainVanillaIris( char *path, std::default_random_engine &generator )
{
    size_t IRIS_INPUT = 4;
    size_t IRIS_HIDDEN = 15;
    size_t IRIS_OUTPUT = 3;

    BasicNeuronBuilder neuronBuilder = BasicNeuronBuilder();

    DenseVanillaLayer input = DenseVanillaLayer( {0, "input", IRIS_INPUT, neuronBuilder} );
    DenseVanillaLayer hidden = DenseVanillaLayer( {0, "hidden1", IRIS_HIDDEN, neuronBuilder} );
    DenseVanillaLayer output = DenseVanillaLayer( {0, "output", IRIS_OUTPUT, neuronBuilder} );

    input.Init( hidden.GetSize(), generator, 0 );
    input.Init( output.GetSize(), generator, 0 );
    input.Init( 0, generator, 0 );

    VanillaSynapseBuilder synapseBuilder = VanillaSynapseBuilder( generator );
    input.BindWithNext( hidden, synapseBuilder );
    hidden.BindWithNext( output, synapseBuilder );

    SPIKING_NN::Dataset data;
    IRIS::ReadIris( path, data, 0.2 );
    DATA_CONVERSION::ConvertDataToTimings( data, 1 );

    float EPS = 1e-1;
    float LEARNING_RATE = 0.1;
    float SIMULATION_TIME = 1000;

    for ( int epochId = 0; epochId < SIMULATION_TIME; epochId++ ) {
        float totalLoss = 0.f;
        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            for ( int activationId = 0; activationId < input.GetSize(); ++activationId ) {
                input[activationId]->ProcessInputSpike( 0, data.xTrain[sampleId][activationId] );
            }
            hidden.Forward();
            output.Forward();

            std::vector<float> deltas;
            std::vector<float> softMax;
            float S = 0;
            auto result = std::vector<float>( output.GetSize());
            for ( size_t idx = 0; idx < output.GetSize(); ++idx ) {
                result[idx] = output[idx]->GetOutput();
            }
            float loss = SoftMaxLoss( result, data.yTrain[sampleId], softMax, deltas, &S );
            totalLoss += loss;

            output.Backward( deltas ), hidden.Backward( {} ), input.Backward( {} );

            output.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, false, 0, false );
            hidden.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, false, 0, false );
            input.GradStep( 1, LEARNING_RATE, LEARNING_RATE, 0, true, 0, false );

            output.ResetPotentials().ResetGrad().ResetStats();
            hidden.ResetPotentials().ResetGrad().ResetStats();
            input.ResetPotentials().ResetGrad().ResetStats();
        }
        std::cout << "Loss for epoch: " << epochId << " is: " << totalLoss / data.xTrain.size() << "\n";
    }
}